

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O1

void __thiscall BmsNoteManager::Mirror(BmsNoteManager *this,int s,int e)

{
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *__t;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *this_00;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (e - s) + 1;
  if (1 < (int)uVar1) {
    uVar2 = (ulong)(uVar1 >> 1);
    __t = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
           *)(this->lanes_ + e);
    this_00 = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
               *)(this->lanes_ + s);
    do {
      std::
      _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
      ::swap(this_00,__t);
      __t = __t + -0x30;
      this_00 = this_00 + 0x30;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void BmsNoteManager::Mirror(int s, int e) {
	// soooooooo easy one
	// (excludes scratch)
	int keycount = e - s + 1;
	for (int i = 0; i < keycount / 2; i++) {
		int lane = s + i;
		int target = e - i;
		swap(lanes_[lane], lanes_[target]);
	}
}